

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O0

int QSqlQueryModelSql::select
              (int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
              timeval *__timeout)

{
  long lVar1;
  QLatin1StringView latin1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffe0;
  QString *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = select(__nfds,__readfds,__writefds,__exceptfds,__timeout);
  latin1.m_data = (char *)in_stack_ffffffffffffffe8;
  latin1.m_size = (qsizetype)in_stack_ffffffffffffffe0;
  QString::QString((QString *)CONCAT44(extraout_var,iVar2),latin1);
  concat(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QString::~QString((QString *)0x15e272);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __nfds;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString select(const QString &s) { return concat(select(), s); }